

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O1

bool __thiscall xray_re::xr_level_ps_static::save(xr_level_ps_static *this,char *path,char *name)

{
  int iVar1;
  xr_writer *w;
  
  if (xr_file_system::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0);
    if (iVar1 != 0) {
      xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
      __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,
                   &__dso_handle);
      __cxa_guard_release(&xr_file_system::instance()::instance0);
    }
  }
  w = xr_file_system::w_open(&xr_file_system::instance::instance0,path,name);
  if (w != (xr_writer *)0x0) {
    save(this,w);
    (*w->_vptr_xr_writer[1])(w);
  }
  return w != (xr_writer *)0x0;
}

Assistant:

bool xr_level_ps_static::save(const char* path, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path, name);
	if (w == 0)
		return false;
	save(*w);
	fs.w_close(w);
	return true;
}